

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1driver.c
# Opt level: O1

FT_UInt t1_get_name_index(T1_Face face,FT_String *glyph_name)

{
  FT_String **ppFVar1;
  ulong uVar2;
  int iVar3;
  ulong in_RAX;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(face->type1).num_glyphs;
  if (0 < (long)uVar5) {
    ppFVar1 = (face->type1).glyph_names;
    uVar4 = 0;
    do {
      iVar3 = strcmp(glyph_name,ppFVar1[uVar4]);
      uVar2 = uVar4;
      if (iVar3 != 0) {
        uVar2 = in_RAX;
      }
      in_RAX = uVar2 & 0xffffffff;
      if (iVar3 == 0) {
        return (FT_UInt)uVar2;
      }
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  return 0;
}

Assistant:

static FT_UInt
  t1_get_name_index( T1_Face     face,
                     FT_String*  glyph_name )
  {
    FT_Int  i;


    for ( i = 0; i < face->type1.num_glyphs; i++ )
    {
      FT_String*  gname = face->type1.glyph_names[i];


      if ( !ft_strcmp( glyph_name, gname ) )
        return (FT_UInt)i;
    }

    return 0;
  }